

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Maybe<const_kj::ReadableDirectory_&> __thiscall
capnp::compiler::CompilerMain::getSourceDirectory
          (CompilerMain *this,StringPtr pathStr,bool isSourcePrefix)

{
  HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory> *this_00;
  PathPtr other;
  undefined8 uVar1;
  ReadableDirectory *pRVar2;
  String *pSVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> MVar6;
  String *key;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  String *pSVar7;
  String *pSVar8;
  ulong uVar9;
  size_t extraout_RDX;
  char *pcVar10;
  size_t sVar11;
  String prefix;
  Path path;
  PathPtr cwd;
  undefined1 local_129 [9];
  String *pSStack_120;
  ArrayDisposer *local_118;
  Path local_108;
  SourceDirectory local_e8;
  SourceDirectory local_d0;
  String local_b8;
  Path local_98;
  Path local_78;
  String *local_58;
  PathPtr local_50;
  char *local_40;
  long local_38;
  undefined4 extraout_var_00;
  
  uVar9 = pathStr.content.size_;
  pcVar10 = pathStr.content.ptr;
  iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_50.parts.ptr = (String *)CONCAT44(extraout_var,iVar5);
  local_50.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&local_108,&local_50,pathStr);
  if ((String *)local_108.parts.size_ == (String *)0x0) {
    iVar5 = (**((this->disk).ptr)->_vptr_Filesystem)();
    key = (String *)CONCAT44(extraout_var_00,iVar5);
  }
  else {
    this_00 = &this->sourceDirectories;
    MVar6 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::find<kj::Path&>
                      ((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *)this_00,
                       &local_108);
    if (MVar6.ptr == (SourceDirectory *)0x0) {
      other.parts.size_ = local_50.parts.size_;
      other.parts.ptr = local_50.parts.ptr;
      local_129._1_8_ = local_108.parts.ptr;
      pSStack_120 = (String *)local_108.parts.size_;
      bVar4 = kj::PathPtr::operator==((PathPtr *)(local_129 + 1),other);
      if (bVar4) {
        iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
        key = (String *)CONCAT44(extraout_var_01,iVar5);
        if (isSourcePrefix) {
          local_78.parts.ptr = local_108.parts.ptr;
          local_78.parts.size_ = local_108.parts.size_;
          local_78.parts.disposer = local_108.parts.disposer;
          local_108.parts.ptr = (String *)0x0;
          local_108.parts.size_ = 0;
          local_d0.dir.disposer = (Disposer *)&kj::NullDisposer::instance;
          local_d0.dir.ptr = (ReadableDirectory *)key;
          local_d0.isSourcePrefix = isSourcePrefix;
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (this_00,&local_78,&local_d0);
          pRVar2 = local_d0.dir.ptr;
          if ((String *)local_d0.dir.ptr != (String *)0x0) {
            local_d0.dir.ptr = (ReadableDirectory *)0x0;
            (**(local_d0.dir.disposer)->_vptr_Disposer)
                      (local_d0.dir.disposer,
                       (_func_int *)
                       ((long)&((Array<char> *)&pRVar2->super_FsNode)->ptr +
                       (long)*(_func_int **)
                              ((long)((Array<char> *)&pRVar2->super_FsNode)->ptr + -0x10)));
          }
          sVar11 = local_78.parts.size_;
          pSVar7 = local_78.parts.ptr;
          if (local_78.parts.ptr != (String *)0x0) {
            local_78.parts.ptr = (String *)0x0;
            local_78.parts.size_ = 0;
            (**(local_78.parts.disposer)->_vptr_ArrayDisposer)
                      (local_78.parts.disposer,pSVar7,0x18,sVar11,sVar11,
                       kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          }
        }
      }
      else {
        iVar5 = (**((this->disk).ptr)->_vptr_Filesystem)();
        pSVar7 = (String *)local_108.parts.size_;
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x58))
                  (local_129 + 1,(long *)CONCAT44(extraout_var_02,iVar5),local_108.parts.ptr);
        key = pSStack_120;
        if (pSStack_120 == (String *)0x0) {
          key = (String *)0x0;
        }
        else {
          local_98.parts.ptr = local_108.parts.ptr;
          local_98.parts.size_ = local_108.parts.size_;
          local_98.parts.disposer = local_108.parts.disposer;
          local_108.parts.ptr = (String *)0x0;
          local_108.parts.size_ = 0;
          local_58 = (String *)local_129._1_8_;
          local_e8.dir.disposer = (Disposer *)local_129._1_8_;
          local_e8.dir.ptr = (ReadableDirectory *)pSStack_120;
          local_e8.isSourcePrefix = isSourcePrefix;
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (this_00,&local_98,&local_e8);
          pRVar2 = local_e8.dir.ptr;
          if ((String *)local_e8.dir.ptr != (String *)0x0) {
            local_e8.dir.ptr = (ReadableDirectory *)0x0;
            (**(_func_int **)((Array<char> *)&(local_e8.dir.disposer)->_vptr_Disposer)->ptr)
                      (local_e8.dir.disposer,
                       (_func_int *)
                       ((long)&((Array<char> *)&pRVar2->super_FsNode)->ptr +
                       (long)*(_func_int **)
                              ((long)((Array<char> *)&pRVar2->super_FsNode)->ptr + -0x10)));
          }
          pSVar8 = (String *)local_98.parts.size_;
          pSVar3 = local_98.parts.ptr;
          if (local_98.parts.ptr != (String *)0x0) {
            local_98.parts.ptr = (String *)0x0;
            local_98.parts.size_ = 0;
            (**(local_98.parts.disposer)->_vptr_ArrayDisposer)
                      (local_98.parts.disposer,pSVar3,0x18,pSVar8,pSVar8,
                       kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
            pSVar7 = pSVar8;
          }
          if ((uVar9 < 2) || (pcVar10[uVar9 - 2] != '/')) {
            local_38 = uVar9 - 1;
            local_129[0] = 0x2f;
            local_40 = pcVar10;
            kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                      ((String *)(local_129 + 1),(_ *)&local_40,(ArrayPtr<const_char> *)local_129,
                       (FixedArray<char,_1UL> *)pSVar7);
          }
          else {
            sVar11 = uVar9 - 1;
            kj::heapString((String *)(local_129 + 1),sVar11);
            if (sVar11 != 0) {
              pSVar7 = pSStack_120;
              if (pSStack_120 != (String *)0x0) {
                pSVar7 = (String *)local_129._1_8_;
              }
              memcpy(pSVar7,pcVar10,sVar11);
            }
          }
          local_b8.content.ptr = (char *)local_129._1_8_;
          local_b8.content.size_ = (size_t)pSStack_120;
          local_b8.content.disposer = local_118;
          local_129._1_8_ = (String *)0x0;
          pSStack_120 = (String *)0x0;
          kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::insert
                    (&this->dirPrefixes,(ReadableDirectory *)key,&local_b8);
          sVar11 = local_b8.content.size_;
          pcVar10 = local_b8.content.ptr;
          if ((String *)local_b8.content.ptr != (String *)0x0) {
            local_b8.content.ptr = (char *)0x0;
            local_b8.content.size_ = 0;
            (**(local_b8.content.disposer)->_vptr_ArrayDisposer)
                      (local_b8.content.disposer,pcVar10,1,sVar11,sVar11,0);
          }
          pSVar7 = pSStack_120;
          uVar1 = local_129._1_8_;
          if ((String *)local_129._1_8_ != (String *)0x0) {
            local_129._1_8_ = (String *)0x0;
            pSStack_120 = (String *)0x0;
            (**local_118->_vptr_ArrayDisposer)(local_118,uVar1,1,pSVar7,pSVar7,0);
          }
        }
      }
    }
    else {
      (MVar6.ptr)->isSourcePrefix = (bool)((MVar6.ptr)->isSourcePrefix | isSourcePrefix);
      key = (String *)((MVar6.ptr)->dir).ptr;
    }
  }
  sVar11 = local_108.parts.size_;
  pSVar7 = local_108.parts.ptr;
  if (local_108.parts.ptr != (String *)0x0) {
    local_108.parts.ptr = (String *)0x0;
    local_108.parts.size_ = 0;
    (**(local_108.parts.disposer)->_vptr_ArrayDisposer)
              (local_108.parts.disposer,pSVar7,0x18,sVar11,sVar11,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return (Maybe<const_kj::ReadableDirectory_&>)(ReadableDirectory *)key;
}

Assistant:

kj::Maybe<const kj::ReadableDirectory&> getSourceDirectory(
      kj::StringPtr pathStr, bool isSourcePrefix) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    if (path.size() == 0) return disk->getRoot();

    KJ_IF_MAYBE(sdir, sourceDirectories.find(path)) {
      sdir->isSourcePrefix = sdir->isSourcePrefix || isSourcePrefix;
      return *sdir->dir;
    }

    if (path == cwd) {
      // Slight hack if the working directory is explicitly specified:
      // - We want to avoid opening a new copy of the working directory, as tryOpenSubdir() would
      //   do.
      // - If isSourcePrefix is true, we need to add it to sourceDirectories to track that.
      //   Otherwise we don't need to add it at all.
      // - We do not need to add it to dirPrefixes since the cwd is already handled in
      //   getDisplayName().
      auto& result = disk->getCurrent();
      if (isSourcePrefix) {
        kj::Own<const kj::ReadableDirectory> fakeOwn(&result, kj::NullDisposer::instance);
        sourceDirectories.insert(kj::mv(path), { kj::mv(fakeOwn), isSourcePrefix });
      }
      return result;
    }

    KJ_IF_MAYBE(dir, disk->getRoot().tryOpenSubdir(path)) {
      auto& result = *dir->get();
      sourceDirectories.insert(kj::mv(path), { kj::mv(*dir), isSourcePrefix });
#if _WIN32
      kj::String prefix = pathStr.endsWith("/") || pathStr.endsWith("\\")
                        ? kj::str(pathStr) : kj::str(pathStr, '\\');
#else
      kj::String prefix = pathStr.endsWith("/") ? kj::str(pathStr) : kj::str(pathStr, '/');
#endif
      dirPrefixes.insert(&result, kj::mv(prefix));
      return result;
    } else {
      return nullptr;
    }
  }